

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

Opnd * __thiscall
BackwardPass::FindNoImplicitCallUse<BackwardPass::UpdateArrayValueTypes(IR::Instr*,IR::Opnd*)::__0>
          (BackwardPass *this,Instr *instr,Opnd *opnd,anon_class_8_1_e7f4faeb IsCheckedUse,
          Instr **noImplicitCallUsesInstrRef)

{
  IRKind IVar1;
  Opnd *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  ObjectType OVar5;
  ObjectType OVar6;
  undefined4 *puVar7;
  long lVar8;
  Opnd *checkedSrcs [2];
  Opnd *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (this == (BackwardPass *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1206,"(instr)","instr");
    if (!bVar3) goto LAB_003eb7bd;
    *puVar7 = 0;
  }
  if (*(short *)&this->currentRegion == 0x246) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                       "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
    if (!bVar3) {
LAB_003eb7bd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  do {
    this = *(BackwardPass **)&this->tag;
    if (this == (BackwardPass *)0x0) {
      return (Opnd *)0x0;
    }
    IVar1 = *(IRKind *)((long)&this->currentInstr + 1);
  } while ((((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) &&
           ((bVar3 = IR::Instr::IsRealInstr((Instr *)this), !bVar3 ||
            ((*(IRKind *)((long)&this->currentInstr + 1) == InstrKindByteCodeUses &&
             (*(OpCode *)&this->currentRegion == ByteCodeUses)))))) &&
          (*(OpCode *)&this->currentRegion != NoImplicitCallUses));
  do {
    if (*(OpCode *)&this->currentRegion != NoImplicitCallUses) {
      return (Opnd *)0x0;
    }
    checkedSrcs[0] = (Opnd *)this->symUsedOnlyForBitOpsBySymId;
    lVar8 = 0;
    do {
      this_00 = checkedSrcs[lVar8 + -1];
      bVar3 = true;
      if (this_00 == (Opnd *)0x0) break;
      bVar4 = IR::Opnd::IsEqual(this_00,(Opnd *)instr);
      if (bVar4) {
        local_32 = (this_00->m_valueType).field_0;
        bVar4 = ValueType::IsLikelyObject((ValueType *)&local_32.field_0);
        if (!bVar4) goto LAB_003eb778;
        OVar5 = ValueType::GetObjectType((ValueType *)&local_32.field_0);
        OVar6 = ValueType::GetObjectType((ValueType *)opnd);
        if (OVar5 != OVar6) goto LAB_003eb778;
        bVar4 = false;
        local_40 = this_00;
      }
      else {
LAB_003eb778:
        bVar4 = true;
      }
      if (!bVar4) {
        bVar3 = false;
        break;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    if (!bVar3) {
      return local_40;
    }
    this = *(BackwardPass **)&this->tag;
    if (this == (BackwardPass *)0x0) {
      return (Opnd *)0x0;
    }
  } while( true );
}

Assistant:

IR::Opnd *
BackwardPass::FindNoImplicitCallUse(
    IR::Instr *const instr,
    IR::Opnd *const opnd,
    const F IsCheckedUse,
    IR::Instr * *const noImplicitCallUsesInstrRef)
{
    Assert(instr);
    Assert(instr->m_opcode != Js::OpCode::NoImplicitCallUses);

    // Skip byte-code uses
    IR::Instr *prevInstr = instr->m_prev;
    while(
        prevInstr &&
        !prevInstr->IsLabelInstr() &&
        (!prevInstr->IsRealInstr() || prevInstr->IsByteCodeUsesInstr()) &&
        prevInstr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        prevInstr = prevInstr->m_prev;
    }

    // Find the corresponding use in a NoImplicitCallUses instruction
    for(; prevInstr && prevInstr->m_opcode == Js::OpCode::NoImplicitCallUses; prevInstr = prevInstr->m_prev)
    {
        IR::Opnd *const checkedSrcs[] = { prevInstr->GetSrc1(), prevInstr->GetSrc2() };
        for(int i = 0; i < sizeof(checkedSrcs) / sizeof(checkedSrcs[0]) && checkedSrcs[i]; ++i)
        {
            IR::Opnd *const checkedSrc = checkedSrcs[i];
            if(checkedSrc->IsEqual(opnd) && IsCheckedUse(checkedSrc))
            {
                if(noImplicitCallUsesInstrRef)
                {
                    *noImplicitCallUsesInstrRef = prevInstr;
                }
                return checkedSrc;
            }
        }
    }

    if(noImplicitCallUsesInstrRef)
    {
        *noImplicitCallUsesInstrRef = nullptr;
    }
    return nullptr;
}